

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontSpecsOf.hpp
# Opt level: O2

void __thiscall sciplot::FontSpecs::~FontSpecs(FontSpecs *this)

{
  ~FontSpecs(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

FontSpecsOf<DerivedSpecs>::FontSpecsOf()
{}